

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_LinearWorkflow::DataCRC(ON_LinearWorkflow *this,ON__UINT32 crc)

{
  int iVar1;
  ON__UINT32 OVar2;
  float dirty;
  float dirty_00;
  ON__INT64 local_28;
  ON__INT64 f [2];
  bool b [4];
  ON__UINT32 crc_local;
  ON_LinearWorkflow *this_local;
  
  f[1]._4_4_ = crc;
  iVar1 = (*this->_vptr_ON_LinearWorkflow[5])();
  f[1]._0_1_ = (byte)iVar1 & 1;
  iVar1 = (*this->_vptr_ON_LinearWorkflow[7])();
  f[1]._1_1_ = (byte)iVar1 & 1;
  iVar1 = (*this->_vptr_ON_LinearWorkflow[9])();
  f[1]._2_1_ = (byte)iVar1 & 1;
  iVar1 = (*this->_vptr_ON_LinearWorkflow[0xf])();
  f[1]._3_1_ = (byte)iVar1 & 1;
  f[1]._4_4_ = ON_CRC32(f[1]._4_4_,4,f + 1);
  (*this->_vptr_ON_LinearWorkflow[0xd])();
  local_28 = Integerize(dirty);
  (*this->_vptr_ON_LinearWorkflow[0x11])();
  f[0] = Integerize(dirty_00);
  OVar2 = ON_CRC32(f[1]._4_4_,0x10,&local_28);
  return OVar2;
}

Assistant:

ON__UINT32 ON_LinearWorkflow::DataCRC(ON__UINT32 crc) const
{
  bool b[] = { PreProcessTexturesOn(), PreProcessColorsOn(), PostProcessFrameBufferOn(), PostProcessGammaOn() };
  crc = ON_CRC32(crc, sizeof(b), b);

  ON__INT64 f[] = { Integerize(PreProcessGamma()), Integerize(PostProcessGamma()) };
  crc = ON_CRC32(crc, sizeof(f), f);

  return crc;
}